

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

RsProdSyntax * __thiscall slang::parsing::Parser::parseRsProd(Parser *this)

{
  Token keyword_00;
  Token openParen_00;
  Token openParen_01;
  Token keyword_01;
  Token keyword_02;
  Token closeParen_00;
  Token closeParen_01;
  bool bVar1;
  RsProdItemSyntax *pRVar2;
  undefined8 in_RDI;
  Token TVar3;
  Token TVar4;
  RsProdItemSyntax *item;
  Token closeParen_1;
  ExpressionSyntax *expr;
  Token openParen_1;
  Token keyword_1;
  RsProdItemSyntax *elseItem;
  Token elseKeyword;
  RsElseClauseSyntax *elseClause;
  RsProdItemSyntax *ifItem;
  Token closeParen;
  ExpressionSyntax *condition;
  Token openParen;
  Token keyword;
  Parser *in_stack_000003a0;
  ParserBase *in_stack_fffffffffffffe98;
  Parser *in_stack_fffffffffffffea0;
  undefined6 in_stack_fffffffffffffea8;
  TokenKind in_stack_fffffffffffffeae;
  ParserBase *in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffed0;
  Info *in_stack_fffffffffffffed8;
  RsProdItemSyntax *in_stack_fffffffffffffee0;
  RsElseClauseSyntax *in_stack_fffffffffffffee8;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined1 in_stack_ffffffffffffff28 [16];
  unkbyte10 Var5;
  Parser *in_stack_ffffffffffffff40;
  undefined8 local_70;
  undefined8 local_60;
  undefined8 local_58;
  undefined2 local_28;
  undefined8 local_10;
  
  Var5 = in_stack_ffffffffffffff28._6_10_;
  TVar3 = ParserBase::peek(in_stack_fffffffffffffe98);
  local_28 = TVar3.kind;
  if (local_28 == Identifier) {
    local_10 = (RsCaseSyntax *)parseRsProdItem((Parser *)CONCAT26(2,in_stack_fffffffffffffec0));
  }
  else if (local_28 == OpenBrace) {
    local_10 = (RsCaseSyntax *)parseRsCodeBlock(in_stack_ffffffffffffff40);
  }
  else if (local_28 == CaseKeyword) {
    local_10 = parseRsCase(in_stack_000003a0);
  }
  else if (local_28 == IfKeyword) {
    ParserBase::consume((ParserBase *)CONCAT26(0xb6,in_stack_fffffffffffffec0));
    ParserBase::expect((ParserBase *)((unkuint10)Var5 >> 0x10),(TokenKind)Var5);
    parseExpression(in_stack_fffffffffffffea0);
    TVar3 = ParserBase::expect((ParserBase *)((unkuint10)Var5 >> 0x10),(TokenKind)Var5);
    pRVar2 = parseRsProdItem((Parser *)CONCAT26(local_28,in_stack_fffffffffffffec0));
    local_70 = (RsElseClauseSyntax *)0x0;
    bVar1 = ParserBase::peek(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeae);
    if (bVar1) {
      ParserBase::consume((ParserBase *)CONCAT26(local_28,in_stack_fffffffffffffec0));
      parseRsProdItem((Parser *)CONCAT26(local_28,in_stack_fffffffffffffec0));
      keyword_00.rawLen._2_2_ = in_stack_fffffffffffffeae;
      keyword_00._0_6_ = in_stack_fffffffffffffea8;
      keyword_00.info = (Info *)in_stack_fffffffffffffeb0;
      local_70 = slang::syntax::SyntaxFactory::rsElseClause
                           ((SyntaxFactory *)in_stack_fffffffffffffea0,keyword_00,
                            (RsProdItemSyntax *)in_stack_fffffffffffffe98);
    }
    local_60 = TVar3._0_8_;
    local_58 = TVar3.info;
    keyword_01.info._0_6_ = in_stack_fffffffffffffec0;
    keyword_01.kind = (short)in_RDI;
    keyword_01._2_1_ = (char)((ulong)in_RDI >> 0x10);
    keyword_01.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
    keyword_01.rawLen = (int)((ulong)in_RDI >> 0x20);
    keyword_01.info._6_2_ = local_28;
    openParen_00.info = (Info *)local_70;
    openParen_00._0_8_ = pRVar2;
    closeParen_00.info = in_stack_fffffffffffffed8;
    closeParen_00.kind = (short)in_stack_fffffffffffffed0;
    closeParen_00._2_1_ = (char)((ulong)in_stack_fffffffffffffed0 >> 0x10);
    closeParen_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffed0 >> 0x18);
    closeParen_00.rawLen = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
    local_10 = (RsCaseSyntax *)
               slang::syntax::SyntaxFactory::rsIfElse
                         ((SyntaxFactory *)local_58,keyword_01,openParen_00,local_60,closeParen_00,
                          in_stack_fffffffffffffee0,in_stack_fffffffffffffee8);
  }
  else if (local_28 == RepeatKeyword) {
    TVar3 = ParserBase::consume((ParserBase *)CONCAT26(0x104,in_stack_fffffffffffffec0));
    Var5 = TVar3._6_10_;
    TVar3 = ParserBase::expect((ParserBase *)TVar3.info,TVar3.rawLen._2_2_);
    parseExpression(in_stack_fffffffffffffea0);
    TVar4 = ParserBase::expect((ParserBase *)((unkuint10)Var5 >> 0x10),(TokenKind)Var5);
    pRVar2 = parseRsProdItem((Parser *)CONCAT26(local_28,in_stack_fffffffffffffec0));
    local_e8 = TVar3._0_8_;
    local_e0 = (RsProdItemSyntax *)TVar3.info;
    local_100 = TVar4._0_8_;
    local_f8 = TVar4.info;
    keyword_02.info._0_6_ = in_stack_fffffffffffffec0;
    keyword_02.kind = (short)in_RDI;
    keyword_02._2_1_ = (char)((ulong)in_RDI >> 0x10);
    keyword_02.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
    keyword_02.rawLen = (int)((ulong)in_RDI >> 0x20);
    keyword_02.info._6_2_ = local_28;
    openParen_01.info = (Info *)in_stack_fffffffffffffeb0;
    openParen_01._0_8_ = pRVar2;
    closeParen_01.info = local_e8;
    closeParen_01._0_8_ = local_f8;
    local_10 = (RsCaseSyntax *)
               slang::syntax::SyntaxFactory::rsRepeat
                         ((SyntaxFactory *)local_f8,keyword_02,openParen_01,local_100,closeParen_01,
                          local_e0);
  }
  else {
    local_10 = (RsCaseSyntax *)0x0;
  }
  return &local_10->super_RsProdSyntax;
}

Assistant:

RsProdSyntax* Parser::parseRsProd() {
    switch (peek().kind) {
        case TokenKind::Identifier:
            return &parseRsProdItem();
        case TokenKind::IfKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& condition = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& ifItem = parseRsProdItem();

            RsElseClauseSyntax* elseClause = nullptr;
            if (peek(TokenKind::ElseKeyword)) {
                auto elseKeyword = consume();
                auto& elseItem = parseRsProdItem();
                elseClause = &factory.rsElseClause(elseKeyword, elseItem);
            }

            return &factory.rsIfElse(keyword, openParen, condition, closeParen, ifItem, elseClause);
        }
        case TokenKind::RepeatKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& expr = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& item = parseRsProdItem();

            return &factory.rsRepeat(keyword, openParen, expr, closeParen, item);
        }
        case TokenKind::CaseKeyword:
            return &parseRsCase();
        case TokenKind::OpenBrace:
            return &parseRsCodeBlock();
        default:
            return nullptr;
    }
}